

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_16x64_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  __m128i *buf;
  int i_1;
  int j;
  int i;
  int height_div8;
  int width_div8;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [128];
  __m128i buf0 [64];
  TX_SIZE tx_size;
  int8_t in_stack_00006707;
  __m128i *in_stack_00006708;
  __m128i *in_stack_00006710;
  undefined8 in_stack_fffffffffffff388;
  __m128i *in;
  int in_stack_fffffffffffff390;
  undefined4 in_stack_fffffffffffff394;
  int stride_00;
  int in_stack_fffffffffffff398;
  int stride_01;
  undefined4 uVar2;
  undefined4 uVar3;
  longlong local_c28 [5];
  __m128i *in_stack_fffffffffffff400;
  __m128i *in_stack_fffffffffffff408;
  longlong local_428 [129];
  undefined1 local_1d;
  
  piVar1 = av1_fwd_txfm_shift_ls[0x11];
  local_1d = 0x11;
  get_txw_idx('\x11');
  get_txh_idx('\x11');
  uVar3 = 2;
  uVar2 = 8;
  for (stride_01 = 0; stride_01 < 2; stride_01 = stride_01 + 1) {
    load_buffer_16bit_to_16bit
              ((int16_t *)CONCAT44(uVar3,uVar2),stride_01,
               (__m128i *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
               (int)((ulong)in_stack_fffffffffffff388 >> 0x20));
    round_shift_16bit((__m128i *)local_428,0x40,(int)*piVar1);
    av1_fdct8x64_new_sse2(in_stack_00006710,in_stack_00006708,in_stack_00006707);
    round_shift_16bit((__m128i *)local_428,0x40,(int)piVar1[1]);
    for (in_stack_fffffffffffff398 = 0; in_stack_fffffffffffff398 < 8;
        in_stack_fffffffffffff398 = in_stack_fffffffffffff398 + 1) {
      transpose_16bit_8x8(in_stack_fffffffffffff408,in_stack_fffffffffffff400);
    }
  }
  for (stride_00 = 0; stride_00 < 4; stride_00 = stride_00 + 1) {
    in = (__m128i *)(local_c28 + (long)(stride_00 << 4) * 2);
    fdct8x16_new_sse2((__m128i *)buf1[0x5d][1],(__m128i *)buf1[0x5d][0],buf1[0x5c][1]._7_1_);
    round_shift_16bit(in,0x10,(int)piVar1[2]);
    store_buffer_16bit_to_32bit_w8
              ((__m128i *)CONCAT44(uVar3,uVar2),
               (int32_t *)CONCAT44(stride_01,in_stack_fffffffffffff398),stride_00,
               in_stack_fffffffffffff390);
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x64_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_16X64;
  __m128i buf0[64], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const transform_1d_sse2 row_txfm = fdct8x16_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < height_div8; ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, 32, 16);
  }
}